

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void sigint_handler(int signo)

{
  common_log *pcVar1;
  undefined4 in_register_0000003c;
  
  if (signo == 2) {
    if ((is_interacting) || (g_params->interactive != true)) {
      console::cleanup((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,signo));
      if (-1 < common_log_verbosity_thold) {
        pcVar1 = common_log_main();
        common_log_add(pcVar1,GGML_LOG_LEVEL_NONE,"\n");
      }
      common_perf_print(*g_ctx,*g_smpl);
      if (-1 < common_log_verbosity_thold) {
        pcVar1 = common_log_main();
        common_log_add(pcVar1,GGML_LOG_LEVEL_NONE,"Interrupted by user\n");
      }
      pcVar1 = common_log_main();
      common_log_pause(pcVar1);
      _exit(0x82);
    }
    is_interacting = true;
    need_insert_eot = 1;
  }
  return;
}

Assistant:

static void sigint_handler(int signo) {
    if (signo == SIGINT) {
        if (!is_interacting && g_params->interactive) {
            is_interacting  = true;
            need_insert_eot = true;
        } else {
            console::cleanup();
            LOG("\n");
            common_perf_print(*g_ctx, *g_smpl);

            // make sure all logs are flushed
            LOG("Interrupted by user\n");
            common_log_pause(common_log_main());

            _exit(130);
        }
    }
}